

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pipe.c
# Opt level: O0

int nni_plat_pipe_open(int *wfd,int *rfd)

{
  int iVar1;
  int *piVar2;
  int local_28;
  int local_24;
  int fds [2];
  int *rfd_local;
  int *wfd_local;
  
  fds = (int  [2])rfd;
  iVar1 = pipe(&local_28);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    wfd_local._4_4_ = nni_plat_errno(*piVar2);
  }
  else {
    *wfd = local_24;
    *(int *)fds = local_28;
    fcntl(local_28,2,1);
    fcntl(local_24,2,1);
    fcntl(local_28,4,0x800);
    fcntl(local_24,4,0x800);
    wfd_local._4_4_ = 0;
  }
  return wfd_local._4_4_;
}

Assistant:

int
nni_plat_pipe_open(int *wfd, int *rfd)
{
	int fds[2];

	if (pipe(fds) < 0) {
		return (nni_plat_errno(errno));
	}
	*wfd = fds[1];
	*rfd = fds[0];

	(void) fcntl(fds[0], F_SETFD, FD_CLOEXEC);
	(void) fcntl(fds[1], F_SETFD, FD_CLOEXEC);
	(void) fcntl(fds[0], F_SETFL, O_NONBLOCK);
	(void) fcntl(fds[1], F_SETFL, O_NONBLOCK);

	return (0);
}